

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  wchar_t *__last;
  long lVar1;
  ulong uVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  wchar_t wVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  int iVar8;
  char_type buffer [26];
  wchar_t awStack_88 [26];
  
  bVar3 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  uVar6 = *(ulong *)this;
  lVar1 = (long)*(int *)(this + 8);
  __last = awStack_88 + lVar1;
  pwVar7 = __last;
  if (uVar6 < 100) {
    if (uVar6 < 10) goto LAB_001899ea;
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    pwVar7 = awStack_88 + lVar1 + -1;
    awStack_88[lVar1 + -1] = (int)(char)internal::basic_data<void>::DIGITS[uVar6 + 1];
  }
  else {
    iVar8 = 0;
    do {
      uVar5 = uVar6;
      uVar6 = uVar5 / 100;
      uVar2 = (ulong)(uint)(((int)uVar5 + (int)uVar6 * -100) * 2);
      pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar2 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar7[-2] = *(wchar_t *)(this + 0xc);
        pwVar7[-3] = (int)(char)internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar1 = -0x10;
          goto LAB_0018999b;
        }
        pwVar7 = pwVar7 + -3;
      }
      else {
        pwVar7[-2] = (int)(char)internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar1 = -0xc;
LAB_0018999b:
          *(undefined4 *)((long)pwVar7 + lVar1) = *(undefined4 *)(this + 0xc);
          pwVar7 = (wchar_t *)((long)pwVar7 + lVar1);
        }
        else {
          pwVar7 = pwVar7 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar5);
    if (uVar5 < 1000) {
LAB_001899ea:
      wVar4 = (uint)uVar6 | 0x30;
      goto LAB_00189a1e;
    }
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
      pwVar7[-2] = *(wchar_t *)(this + 0xc);
      pwVar7 = pwVar7 + -2;
    }
    else {
      pwVar7 = pwVar7 + -1;
    }
  }
  wVar4 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar6];
LAB_00189a1e:
  pwVar7[-1] = wVar4;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (awStack_88,__last,bVar3);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }